

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O2

void ur_df2(double *y,int N,char *type,int *lags,char *selectlags,double *cval,int *cvrows,
           int *cvcols,double *cprobs,double *teststat,int *ltstat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double *oup;
  double *y_00;
  ulong uVar9;
  double *__src;
  double *res;
  void *__ptr;
  double *pdVar10;
  reg_object prVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined *puVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  undefined *puVar22;
  char *__s;
  uint p;
  size_t sVar24;
  double dVar25;
  double dVar26;
  long lStack_100;
  double *local_c0;
  size_t local_48;
  long local_40;
  reg_object local_38;
  ulong uVar23;
  
  if (lags == (int *)0x0) {
    uVar8 = 1;
  }
  else {
    uVar8 = (ulong)(uint)*lags;
    if (*lags < 0) {
      __s = "lags should be > 0. ";
      goto LAB_0014420b;
    }
  }
  p = (int)uVar8 + 1;
  uVar23 = (ulong)p;
  lVar20 = (long)(int)(~p + N);
  lVar17 = lVar20 + 1;
  oup = (double *)malloc((long)N * 8 - 8);
  sVar24 = lVar20 * 8 + 8;
  y_00 = (double *)malloc(sVar24 * uVar23);
  diff(y,N,1,oup);
  uVar16 = uVar8;
  pdVar14 = y_00;
  for (uVar9 = 0; uVar9 != uVar23; uVar9 = uVar9 + 1) {
    for (lVar21 = 0; lVar21 <= lVar20; lVar21 = lVar21 + 1) {
      pdVar14[lVar21] = oup[(int)uVar16 + (int)lVar21];
    }
    pdVar14 = pdVar14 + lVar20 + 1;
    uVar16 = uVar16 - 1;
  }
  __src = (double *)malloc(sVar24);
  res = (double *)malloc(sVar24);
  pdVar14 = __src;
  uVar16 = uVar8;
  while ((long)uVar16 < (long)N + -1) {
    uVar16 = uVar16 + 1;
    *pdVar14 = (double)(int)uVar16;
    pdVar14 = pdVar14 + 1;
  }
  pdVar14 = y + uVar8;
  iVar7 = (int)lVar17;
  if (uVar8 == 0) {
    pdVar10 = (double *)malloc(lVar17 * 0x10);
    iVar6 = strcmp(type,"none");
    if (iVar6 == 0) {
      pdVar12 = (double *)malloc(8);
      local_38 = reg_init(iVar7,1);
      setIntercept(local_38,0);
      memcpy(pdVar10,pdVar14,sVar24);
      regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
      *teststat = local_38->beta[0].value / local_38->beta[0].stdErr;
      *ltstat = 1;
    }
    else {
      iVar6 = strcmp(type,"drift");
      if (iVar6 == 0) {
        pdVar12 = (double *)malloc(0x20);
        local_38 = reg_init(iVar7,2);
        setIntercept(local_38,1);
        memcpy(pdVar10,pdVar14,sVar24);
        regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
        dVar25 = *(double *)(local_38 + 1);
        dVar1 = local_38[1].sigma_lower;
        dVar2 = local_38->RSS;
        iVar6 = local_38->df_RSS;
        prVar11 = reg_init(iVar7,0);
        regress(prVar11,(double *)0x0,y_00,res,pdVar12,0.95);
        dVar3 = prVar11->RSS;
        dVar4 = local_38->RSS;
        iVar7 = prVar11->df_RSS;
        iVar18 = local_38->df_RSS;
        *teststat = dVar25 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar7 - iVar18)) / (dVar2 / (double)iVar6);
        *ltstat = 2;
      }
      else {
        pdVar12 = (double *)malloc(0x48);
        local_38 = reg_init(iVar7,3);
        setIntercept(local_38,1);
        memcpy(pdVar10,pdVar14,sVar24);
        memcpy(pdVar10 + lVar17,__src,sVar24);
        regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
        dVar25 = *(double *)(local_38 + 1);
        dVar1 = local_38[1].sigma_lower;
        dVar26 = local_38->RSS / (double)local_38->df_RSS;
        prVar11 = reg_init(iVar7,0);
        regress(prVar11,(double *)0x0,y_00,res,pdVar12,0.95);
        dVar2 = prVar11->RSS;
        dVar3 = local_38->RSS;
        iVar6 = prVar11->df_RSS;
        iVar18 = local_38->df_RSS;
        free(prVar11);
        prVar11 = reg_init(iVar7,1);
        setIntercept(prVar11,1);
        regress(prVar11,(double *)0x0,y_00,res,pdVar12,0.95);
        dVar4 = prVar11->RSS;
        dVar5 = local_38->RSS;
        iVar7 = prVar11->df_RSS;
        iVar19 = local_38->df_RSS;
        *teststat = dVar25 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar6 - iVar18)) / dVar26;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar7 - iVar19)) / dVar26;
        *ltstat = 3;
      }
      free(prVar11);
    }
  }
  else {
    iVar6 = strcmp(selectlags,"fixed");
    if (iVar6 != 0) {
      __ptr = malloc(uVar23 * 8);
      pdVar10 = (double *)malloc(((int)uVar8 + 2) * sVar24);
      for (uVar16 = 0; uVar23 != uVar16; uVar16 = uVar16 + 1) {
        *(undefined8 *)((long)__ptr + uVar16 * 8) = 0x7ff8000000000000;
      }
      local_40 = 0x20;
      local_48 = lVar17 * 8;
      for (lVar20 = 4; -uVar8 + lVar20 != 4; lVar20 = lVar20 + 1) {
        memcpy(pdVar10,pdVar14,sVar24);
        iVar6 = strcmp(type,"none");
        if (iVar6 == 0) {
          local_c0 = (double *)malloc((local_40 + -0x10) * (lVar20 + -2));
          prVar11 = reg_init(iVar7,(int)(lVar20 + -2));
          iVar6 = 0;
LAB_001436f8:
          setIntercept(prVar11,iVar6);
          pdVar12 = pdVar10 + lVar17;
        }
        else {
          iVar6 = strcmp(type,"drift");
          if (iVar6 == 0) {
            local_c0 = (double *)malloc((local_40 + -8) * (lVar20 + -1));
            prVar11 = reg_init(iVar7,(int)(lVar20 + -1));
            iVar6 = 1;
            goto LAB_001436f8;
          }
          iVar6 = strcmp(type,"trend");
          if (iVar6 != 0) goto LAB_00144204;
          local_c0 = (double *)malloc(local_40 * lVar20);
          prVar11 = reg_init(iVar7,(int)lVar20);
          setIntercept(prVar11,1);
          memcpy(pdVar10 + lVar17,__src,sVar24);
          pdVar12 = pdVar10 + iVar7 * 2;
        }
        memcpy(pdVar12,y_00 + lVar17,local_48);
        regress(prVar11,pdVar10,y_00,res,local_c0,0.95);
        iVar6 = strcmp(selectlags,"aic");
        if (iVar6 == 0) {
          lVar21 = 0x98;
LAB_0014377d:
          *(undefined8 *)((long)__ptr + lVar20 * 8 + -0x18) =
               *(undefined8 *)((long)prVar11->R2 + lVar21 + -0x38);
        }
        else {
          iVar6 = strcmp(selectlags,"bic");
          if (iVar6 == 0) {
            lVar21 = 0xa0;
            goto LAB_0014377d;
          }
        }
        free_reg(prVar11);
        local_48 = local_48 + lVar17 * 8;
        local_40 = local_40 + 8;
      }
      dVar25 = 1.79769313486232e+308;
      uVar9 = 0;
      for (uVar16 = 1; -uVar8 + uVar16 != 1; uVar16 = uVar16 + 1) {
        dVar1 = *(double *)((long)__ptr + uVar16 * 8);
        if (dVar1 < dVar25) {
          uVar9 = uVar16 & 0xffffffff;
          dVar25 = dVar1;
        }
      }
      p = (int)uVar9 + 1;
      free(__ptr);
      free(pdVar10);
      free(local_c0);
    }
    lVar20 = (long)(int)(p + 1);
    pdVar10 = (double *)malloc(sVar24 * lVar20);
    memcpy(pdVar10,pdVar14,sVar24);
    iVar18 = p - 1;
    iVar19 = iVar18 * iVar7;
    iVar6 = strcmp(type,"none");
    if (iVar6 == 0) {
      pdVar12 = (double *)malloc((long)(int)p * (long)(int)p * 8);
      local_38 = reg_init(iVar7,p);
      setIntercept(local_38,0);
      memcpy(pdVar10 + lVar17,y_00 + lVar17,(long)iVar19 << 3);
      regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
      *teststat = local_38->beta[0].value / local_38->beta[0].stdErr;
      *ltstat = 1;
    }
    else {
      iVar6 = strcmp(type,"drift");
      if (iVar6 == 0) {
        pdVar12 = (double *)malloc(lVar20 * lVar20 * 8);
        local_38 = reg_init(iVar7,p + 1);
        setIntercept(local_38,1);
        memcpy(pdVar10 + lVar17,y_00 + lVar17,(long)iVar19 << 3);
        regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
        dVar25 = *(double *)(local_38 + 1);
        dVar1 = local_38[1].sigma_lower;
        iVar6 = local_38->df_RSS;
        dVar2 = local_38->RSS;
        pdVar14 = (double *)malloc(sVar24 * (long)iVar18);
        memcpy(pdVar14,y_00 + lVar17,sVar24 * (long)iVar18);
        prVar11 = reg_init(iVar7,iVar18);
        setIntercept(prVar11,0);
        regress(prVar11,pdVar14,y_00,res,pdVar12,0.95);
        dVar3 = prVar11->RSS;
        dVar4 = local_38->RSS;
        iVar7 = prVar11->df_RSS;
        iVar18 = local_38->df_RSS;
        *teststat = dVar25 / dVar1;
        teststat[1] = ((dVar3 - dVar4) / (double)(iVar7 - iVar18)) / (dVar2 / (double)iVar6);
        *ltstat = 2;
        free(pdVar14);
      }
      else {
        iVar6 = strcmp(type,"trend");
        if (iVar6 != 0) {
LAB_00144204:
          __s = "type only accepts one of three values - none, drift and trend ";
LAB_0014420b:
          puts(__s);
          exit(-1);
        }
        iVar6 = p + 2;
        pdVar12 = (double *)malloc((long)iVar6 * (long)iVar6 * 8);
        local_38 = reg_init(iVar7,iVar6);
        setIntercept(local_38,1);
        memcpy(pdVar10 + lVar17,__src,sVar24);
        pdVar14 = y_00 + lVar17;
        memcpy(pdVar10 + iVar7 * 2,pdVar14,(long)iVar19 << 3);
        regress(local_38,pdVar10,y_00,res,pdVar12,0.95);
        dVar25 = *(double *)(local_38 + 1);
        dVar1 = local_38[1].sigma_lower;
        dVar26 = local_38->RSS / (double)local_38->df_RSS;
        sVar24 = sVar24 * (long)iVar18;
        pdVar13 = (double *)malloc(sVar24);
        memcpy(pdVar13,pdVar14,sVar24);
        prVar11 = reg_init(iVar7,iVar18);
        setIntercept(prVar11,0);
        regress(prVar11,pdVar13,y_00,res,pdVar12,0.95);
        dVar2 = prVar11->RSS;
        dVar3 = local_38->RSS;
        iVar6 = prVar11->df_RSS;
        iVar18 = local_38->df_RSS;
        free(pdVar13);
        free(prVar11);
        pdVar13 = (double *)malloc(sVar24);
        memcpy(pdVar13,pdVar14,sVar24);
        prVar11 = reg_init(iVar7,p);
        setIntercept(prVar11,1);
        regress(prVar11,pdVar13,y_00,res,pdVar12,0.95);
        dVar4 = prVar11->RSS;
        dVar5 = local_38->RSS;
        iVar7 = prVar11->df_RSS;
        iVar19 = local_38->df_RSS;
        *teststat = dVar25 / dVar1;
        teststat[1] = ((dVar2 - dVar3) / (double)(iVar6 - iVar18)) / dVar26;
        teststat[2] = ((dVar4 - dVar5) / (double)(iVar7 - iVar19)) / dVar26;
        *ltstat = 3;
        free(pdVar13);
      }
      free(prVar11);
    }
  }
  free(pdVar10);
  free(pdVar12);
  if (N < 0x1a) {
    lStack_100 = 0;
  }
  else if ((uint)N < 0x33) {
    lStack_100 = 3;
  }
  else if ((uint)N < 0x65) {
    lStack_100 = 6;
  }
  else if ((uint)N < 0xfb) {
    lStack_100 = 9;
  }
  else {
    lStack_100 = (ulong)(500 < (uint)N) * 3 + 0xc;
  }
  iVar7 = strcmp(type,"none");
  if (iVar7 == 0) {
    puVar15 = &DAT_00150dc0;
    iVar7 = 1;
  }
  else {
    iVar7 = strcmp(type,"drift");
    if (iVar7 == 0) {
      iVar7 = 2;
      puVar15 = &DAT_00150f70;
      lVar17 = 0x18;
      puVar22 = &DAT_00150e50;
      pdVar14 = cval;
    }
    else {
      iVar7 = strcmp(type,"trend");
      if (iVar7 != 0) goto LAB_00144181;
      cval[2] = (double)(&DAT_00150ef0)[lStack_100];
      dVar25 = *(double *)(&UNK_00150ee8 + lStack_100 * 8);
      *cval = *(double *)(&DAT_00150ee0 + lStack_100 * 8);
      cval[1] = dVar25;
      iVar7 = 3;
      puVar15 = &DAT_00151090;
      lVar17 = 0x30;
      puVar22 = &DAT_00151000;
      pdVar14 = cval + 3;
    }
    pdVar14[2] = *(double *)(puVar22 + lStack_100 * 8 + 0x10);
    dVar25 = *(double *)((long)(puVar22 + lStack_100 * 8) + 8);
    *pdVar14 = *(double *)(puVar22 + lStack_100 * 8);
    pdVar14[1] = dVar25;
    cval = (double *)((long)cval + lVar17);
  }
  cval[2] = *(double *)(puVar15 + lStack_100 * 8 + 0x10);
  dVar25 = *(double *)((long)(puVar15 + lStack_100 * 8) + 8);
  *cval = *(double *)(puVar15 + lStack_100 * 8);
  cval[1] = dVar25;
  *cvrows = iVar7;
  *cvcols = 3;
LAB_00144181:
  *cprobs = 0.01;
  cprobs[1] = 0.05;
  cprobs[2] = 0.1;
  free(y_00);
  free(oup);
  free(__src);
  free(res);
  free(local_38);
  return;
}

Assistant:

void ur_df2(double *y, int N,const char* type, int *lags,const char *selectlags,double *cval,int *cvrows, int *cvcols, double *cprobs, double *teststat,int *ltstat) {
    int lags_, lag, N1, N2,i,j,iter,p,ltmp,p1,p2,p3,rowselec,row1;
    double *z, *x,*z_diff,*z_lag_1,*tt,*critRes,*z_diff_lag,*XX,*varcovar,*res,*XX2,*XX3;
    reg_object fit, phi1_fit,phi2_fit,phi3_fit;
    double alpha = 0.95;
    double ctemp,tau,scale,sos,dfs,phi1,phi2,phi3;
    double cval_tau1[18] = {-2.66, -1.95, -1.60,-2.62, -1.95, -1.61,-2.60, -1.95, -1.61,-2.58, -1.95, -1.62,
        -2.58, -1.95, -1.62,-2.58, -1.95, -1.62};
    double cval_tau2[18] = {-3.75, -3.00, -2.63,-3.58, -2.93, -2.60,-3.51, -2.89, -2.58,-3.46, -2.88, -2.57,
        -3.44, -2.87, -2.57,-3.43, -2.86, -2.57};
    double cval_tau3[18] = {-4.38, -3.60, -3.24,-4.15, -3.50, -3.18,-4.04, -3.45, -3.15,-3.99, -3.43, -3.13,
        -3.98, -3.42, -3.13,-3.96, -3.41, -3.12};
    double cval_phi1[18] = {7.88, 5.18, 4.12,7.06, 4.86, 3.94,6.70, 4.71, 3.86,6.52, 4.63, 3.81,6.47, 4.61,
         3.79,6.43, 4.59, 3.78};
    double cval_phi2[18] = {8.21, 5.68, 4.67,7.02, 5.13, 4.31,6.50, 4.88, 4.16,6.22, 4.75, 4.07,6.15, 4.71,
         4.05,6.09, 4.68, 4.03};
    double cval_phi3[18] = {10.61, 7.24, 5.91,9.31, 6.73, 5.61,8.73, 6.49, 5.47,8.43, 6.49, 5.47,8.34, 6.30,
         5.36,8.27, 6.25, 5.34};

    lags_ = (lags == NULL) ? 1 : *lags;
    lag = lags_;

    if (lag < 0) {
        printf("lags should be > 0. \n");
        exit(-1);
    }

    lags_+=1;

    N1 = N - 1;
    N2 = N1 - lags_ + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*N2*lags_);
    

    diff(y,N,1,z);// z = y(t) - y(t-1)
    
    for(i = 0; i < lags_;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags_+j-i-1];
        }
    } 


    z_diff = &x[0];//length N2
    z_lag_1 = &y[lags_-1];//length N2


    tt = (double*)malloc(sizeof(double)*N2);
    res = (double*)malloc(sizeof(double)*N2);

    for(i = lags_ - 1; i < N1;++i) {
        tt[i - lags_ +1] = i+1;
    }

    if (lags_ > 1) {
        if (strcmp(selectlags,"fixed")) {
            critRes = (double*) malloc(sizeof(double)*lags_);
            XX = (double*)malloc(sizeof(double)*N2*(lags_+1));
            for(i = 0; i < lags_;++i) {
                critRes[i] = NAN;
            }

            for(i = 1; i < lags_;++i) {
                iter = i * N2;

                memcpy(XX,z_lag_1,sizeof(double)*N2);

                if (!strcmp(type,"none")) {
                    p = 1 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,0);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);
                    
                } else if (!strcmp(type,"drift")) {
                    p = 2 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else if (!strcmp(type,"trend")) {
                    p = 3 + i;
                    varcovar = (double*)malloc(sizeof(double)*p*p);
                    fit = reg_init(N2,p);
                    setIntercept(fit,1);
                    memcpy(XX+N2,tt,sizeof(double)*N2);
                    memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
                    regress(fit,XX,z_diff,res,varcovar,alpha);

                } else {
                    printf("type only accepts one of three values - none, drift and trend \n");
                    exit(-1);
                }

                if (!strcmp(selectlags,"aic")) {
                    critRes[i] = fit->aic;
                } else if (!strcmp(selectlags,"bic")) {
                    critRes[i] = fit->bic;
                }

                free_reg(fit);
            }

            ctemp = DBL_MAX;
            ltmp = 0;

            for(i = 1; i < lags_;++i) {
                if (critRes[i] < ctemp) {
                    ctemp = critRes[i];
                    ltmp = i;
                }
            }

            lags_ = ltmp+1;


            free(critRes);
            free(XX);
            free(varcovar);
        }

        XX = (double*)malloc(sizeof(double)*N2*(lags_+1));

        memcpy(XX,z_lag_1,sizeof(double)*N2);
        iter = (lags_-1) * N2;

        if (!strcmp(type,"none")) {
            p = lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 1 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p1 = lags_ - 1;
            phi1_fit = reg_init(N2,p1);
            setIntercept(phi1_fit,0);
            regress(phi1_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;


            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(XX2);
            free(phi1_fit);
        } else if (!strcmp(type,"trend")) {
            p = 2 + lags_;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            memcpy(XX+2*N2,x+N2,sizeof(double)*iter);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            XX2 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX2,x+N2,sizeof(double)*N2*(lags_-1));
            p2 = lags_ - 1;
            phi2_fit = reg_init(N2,p2);
            setIntercept(phi2_fit,0);
            regress(phi2_fit,XX2,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;


            free(XX2);
            free(phi2_fit);

            XX3 = (double*)malloc(sizeof(double)*N2*(lags_-1));
            memcpy(XX3,x+N2,sizeof(double)*N2*(lags_-1));
            p3 = lags_;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,XX3,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(XX3);
            free(phi3_fit);
        } else {
            printf("type only accepts one of three values - none, drift and trend \n");
            exit(-1);
        }

        free(XX);
        free(varcovar);

    } else {
        XX = (double*)malloc(sizeof(double)*2*N2);
        if (!strcmp(type,"none")) {
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,0);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 0)->value / (fit->beta + 0)->stdErr;
            teststat[0] = tau;
            *ltstat = 1;
        } else if (!strcmp(type,"drift")) {
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p1 = 0;
            phi1_fit = reg_init(N2,p1);
            regress(phi1_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi1_fit->RSS - fit->RSS;
            dfs = (double) (phi1_fit->df_RSS - fit->df_RSS);

            phi1 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi1;
            *ltstat = 2;

            free(phi1_fit);

        } else if (!strcmp(type,"trend")) {
            p = 3;
            varcovar = (double*)malloc(sizeof(double)*p*p);
            fit = reg_init(N2,p);
            setIntercept(fit,1);
            memcpy(XX,z_lag_1,sizeof(double)*N2);
            memcpy(XX+N2,tt,sizeof(double)*N2);
            regress(fit,XX,z_diff,res,varcovar,alpha);
            tau = (fit->beta + 1)->value / (fit->beta + 1)->stdErr;

            scale = fit->RSS/(double)fit->df_RSS;

            p2 = 0;
            phi2_fit = reg_init(N2,p2);
            regress(phi2_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi2_fit->RSS - fit->RSS;
            dfs = (double) (phi2_fit->df_RSS - fit->df_RSS);

            phi2 = sos/dfs/scale;

            free(phi2_fit);

            p3 = 1;
            phi3_fit = reg_init(N2,p3);
            setIntercept(phi3_fit,1);
            regress(phi3_fit,NULL,z_diff,res,varcovar,alpha);

            sos = phi3_fit->RSS - fit->RSS;
            dfs = (double) (phi3_fit->df_RSS - fit->df_RSS);

            phi3 = sos/dfs/scale;

            teststat[0] = tau;
            teststat[1] = phi2;
            teststat[2] = phi3;
            *ltstat = 3;

            free(phi3_fit);
        }

        free(XX);
        free(varcovar);
    }

    
    if (N1 < 25){
        rowselec = 1;
    } else if (N1 < 50) {
        rowselec = 2;
    } else if (N1 < 100) {
        rowselec = 3;
    } else if (N1 < 250) {
        rowselec = 4;
    } else if (N1 < 500) {
        rowselec = 5;
    } else {
        rowselec = 6;
    }
    row1 = rowselec - 1;

    if (!strcmp(type,"none")) {
        memcpy(cval,cval_tau1+row1*3,sizeof(double)*3);
        *cvrows = 1;
        *cvcols = 3;
    } else if (!strcmp(type,"drift")) {
        memcpy(cval,cval_tau2+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi1+row1*3,sizeof(double)*3);
        *cvrows = 2;
        *cvcols = 3;
    } else if (!strcmp(type,"trend")) {
        memcpy(cval,cval_tau3+row1*3,sizeof(double)*3);
        memcpy(cval+3,cval_phi2+row1*3,sizeof(double)*3);
        memcpy(cval+6,cval_phi3+row1*3,sizeof(double)*3);
        *cvrows = 3;
        *cvcols = 3;
    }


    cprobs[0] = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;

    free(x);
    free(z);
    free(tt);
    free(res);
    free(fit);
}